

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_path_and_type.cpp
# Opt level: O1

void duckdb::DBPathAndType::ExtractExtensionPrefix(string *path,string *db_type)

{
  string extension;
  string local_58;
  string local_38;
  
  ExtensionHelper::ExtractExtensionPrefixFromPath(&local_38,path);
  if (local_38._M_string_length != 0) {
    ::std::__cxx11::string::substr((ulong)&local_58,(ulong)path);
    ::std::__cxx11::string::operator=((string *)path,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    ExtensionHelper::ApplyExtensionAlias(&local_58,&local_38);
    ::std::__cxx11::string::operator=((string *)db_type,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DBPathAndType::ExtractExtensionPrefix(string &path, string &db_type) {
	auto extension = ExtensionHelper::ExtractExtensionPrefixFromPath(path);
	if (!extension.empty()) {
		// path is prefixed with an extension - remove the first occurence of it
		path = path.substr(extension.length() + 1);
		db_type = ExtensionHelper::ApplyExtensionAlias(extension);
	}
}